

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O3

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::fromTo
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *from,
          VerySimpleReadOnlyString *to,bool includeFind)

{
  uint uVar1;
  tCharPtr pcVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  undefined7 in_register_00000009;
  uint uVar6;
  ulong uVar7;
  ulong extraout_RDX;
  uint uVar8;
  ulong uVar9;
  char *__s;
  char in_R8B;
  uint uVar10;
  uint uVar11;
  int iVar12;
  VerySimpleReadOnlyString VVar13;
  
  uVar1 = from->length;
  pcVar2 = from->data;
  iVar3 = 0;
  uVar7 = 0;
  do {
    uVar5 = (uint)uVar7;
    uVar10 = uVar5;
    if (uVar5 < uVar1) {
      uVar10 = uVar1;
    }
    uVar9 = 0;
LAB_0010e54c:
    iVar12 = (int)uVar9;
    if (uVar10 + iVar3 == iVar12) {
      uVar7 = (ulong)uVar1;
      goto LAB_0010e575;
    }
    if (to->data[uVar9] == pcVar2[uVar5 + iVar12]) break;
    uVar7 = (ulong)(uVar5 + 1);
    iVar3 = iVar3 + -1;
  } while( true );
  uVar9 = (ulong)(iVar12 + 1U);
  if (to->length == iVar12 + 1U) {
LAB_0010e575:
    uVar6 = (uint)uVar7;
    uVar8 = to->length + uVar6;
    uVar10 = *(uint *)((long *)CONCAT71(in_register_00000009,includeFind) + 1);
    uVar5 = uVar8;
    goto LAB_0010e57f;
  }
  goto LAB_0010e54c;
LAB_0010e57f:
  uVar11 = 0;
LAB_0010e582:
  if (uVar1 <= uVar5 + uVar11) {
    uVar9 = (ulong)uVar8;
    if (in_R8B != '\0') {
      uVar9 = uVar7;
    }
    __s = "";
    if (uVar6 < uVar1) {
      __s = pcVar2 + uVar9;
    }
    goto LAB_0010e5eb;
  }
  if (*(char *)(*(long *)CONCAT71(in_register_00000009,includeFind) + (ulong)uVar11) ==
      pcVar2[uVar5 + uVar11]) goto code_r0x0010e59b;
  uVar5 = uVar5 + 1;
  goto LAB_0010e57f;
code_r0x0010e59b:
  uVar11 = uVar11 + 1;
  if (uVar10 != uVar11) goto LAB_0010e582;
  uVar9 = (ulong)uVar8;
  if (in_R8B != '\0') {
    uVar9 = uVar7;
  }
  __s = "";
  if (uVar6 < uVar1) {
    __s = pcVar2 + uVar9;
  }
  if (uVar1 <= uVar5) goto LAB_0010e5eb;
  if (in_R8B == '\0') {
    iVar3 = uVar5 - uVar8;
  }
  else {
    iVar3 = (uVar10 - uVar6) + uVar5;
  }
  goto LAB_0010e603;
LAB_0010e5eb:
  if (in_R8B == '\0') {
    this->data = __s;
  }
  else {
    iVar3 = uVar1 - uVar6;
LAB_0010e603:
    this->data = __s;
    if (iVar3 != -1) goto LAB_0010e615;
    if (__s != (char *)0x0) {
      sVar4 = strlen(__s);
      iVar3 = (int)sVar4;
      uVar7 = extraout_RDX;
      goto LAB_0010e615;
    }
  }
  iVar3 = 0;
LAB_0010e615:
  this->length = iVar3;
  VVar13._8_8_ = uVar7;
  VVar13.data = (tCharPtr)this;
  return VVar13;
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::fromTo(const VerySimpleReadOnlyString & from, const VerySimpleReadOnlyString & to, const bool includeFind) const
	{
	    const unsigned int fromPos = Find(from);
	    const unsigned int toPos = Find(to, fromPos + from.length);
	    return VerySimpleReadOnlyString(fromPos >= (unsigned int)length ? "" : &data[includeFind ? fromPos : fromPos + (unsigned int)from.length],
	                                    toPos < (unsigned int)length ? (includeFind ? toPos + (unsigned int)to.length - fromPos : toPos - fromPos - (unsigned int)from.length)
	                                       // If the "to" needle was not found, either we return the whole string (includeFind) or an empty string
	                                       : (includeFind ? (unsigned int)length - fromPos : 0));
	}